

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::VaryingLocationsTest::getProgramInterface
          (VaryingLocationsTest *this,GLuint test_case_index,ProgramInterface *program_interface,
          VaryingPassthrough *varying_passthrough)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  Type local_38;
  
  local_38 = TestBase::getType((TestBase *)this,test_case_index);
  Utils::Type::GenerateDataPacked
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50,&local_38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&this->m_first_data,&local_50);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
  Utils::Type::GenerateDataPacked
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50,&local_38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&this->m_last_data,&local_50);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
  (*(this->super_TextureTestBase).super_TestBase.super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[0x21])(this,5,&local_38,program_interface,varying_passthrough);
  (*(this->super_TextureTestBase).super_TestBase.super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[0x21])(this,4,&local_38,program_interface,varying_passthrough);
  (*(this->super_TextureTestBase).super_TestBase.super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[0x21])(this,2,&local_38,program_interface,varying_passthrough);
  (*(this->super_TextureTestBase).super_TestBase.super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[0x21])(this,3,&local_38,program_interface,varying_passthrough);
  (*(this->super_TextureTestBase).super_TestBase.super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[0x21])(this,1,&local_38,program_interface,varying_passthrough);
  return;
}

Assistant:

void VaryingLocationsTest::getProgramInterface(GLuint test_case_index, Utils::ProgramInterface& program_interface,
											   Utils::VaryingPassthrough& varying_passthrough)
{
	const Utils::Type type = getType(test_case_index);

	m_first_data = type.GenerateDataPacked();
	m_last_data  = type.GenerateDataPacked();

	prepareShaderStage(Utils::Shader::FRAGMENT, type, program_interface, varying_passthrough);
	prepareShaderStage(Utils::Shader::GEOMETRY, type, program_interface, varying_passthrough);
	prepareShaderStage(Utils::Shader::TESS_CTRL, type, program_interface, varying_passthrough);
	prepareShaderStage(Utils::Shader::TESS_EVAL, type, program_interface, varying_passthrough);
	prepareShaderStage(Utils::Shader::VERTEX, type, program_interface, varying_passthrough);
}